

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O0

void __thiscall xmrig::OclLaunchStatus::print(OclLaunchStatus *this)

{
  long lVar1;
  long lVar2;
  undefined *puVar3;
  uint64_t uVar4;
  long *in_RDI;
  char *local_20;
  
  puVar3 = tag;
  if (in_RDI[1] == 0) {
    Log::print(ERR,"%s \x1b[1;31mdisabled\x1b[0m\x1b[0;33m (failed to start threads)\x1b[0m",tag);
  }
  else {
    if (*in_RDI == 0) {
      local_20 = "\x1b[1;36m";
    }
    else {
      local_20 = "\x1b[1;33m";
    }
    lVar1 = in_RDI[1];
    lVar2 = in_RDI[2];
    uVar4 = Chrono::steadyMSecs();
    Log::print(INFO,"%s\x1b[1;32m READY\x1b[0m threads %s%zu/%zu\x1b[1;30m (%lu ms)\x1b[0m",puVar3,
               local_20,lVar1,lVar2,uVar4 - in_RDI[3]);
  }
  return;
}

Assistant:

inline void print() const
    {
        if (m_started == 0) {
            LOG_ERR("%s " RED_BOLD("disabled") YELLOW(" (failed to start threads)"), tag);

            return;
        }

        LOG_INFO("%s" GREEN_BOLD(" READY") " threads " "%s%zu/%zu" BLACK_BOLD(" (%" PRIu64 " ms)"),
                 tag,
                 m_errors == 0 ? CYAN_BOLD_S : YELLOW_BOLD_S,
                 m_started,
                 m_threads,
                 Chrono::steadyMSecs() - m_ts
                 );
    }